

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void HMAC_finish(uECC_HashContext *hash_context,uint8_t *K,uint8_t *result)

{
  uint8_t *puVar1;
  uint local_2c;
  uint i;
  uint8_t *pad;
  uint8_t *result_local;
  uint8_t *K_local;
  uECC_HashContext *hash_context_local;
  
  puVar1 = hash_context->tmp + (hash_context->result_size << 1);
  for (local_2c = 0; local_2c < hash_context->result_size; local_2c = local_2c + 1) {
    puVar1[local_2c] = K[local_2c] ^ 0x5c;
  }
  for (; local_2c < hash_context->block_size; local_2c = local_2c + 1) {
    puVar1[local_2c] = '\\';
  }
  (*hash_context->finish_hash)(hash_context,result);
  (*hash_context->init_hash)(hash_context);
  (*hash_context->update_hash)(hash_context,puVar1,hash_context->block_size);
  (*hash_context->update_hash)(hash_context,result,hash_context->result_size);
  (*hash_context->finish_hash)(hash_context,result);
  return;
}

Assistant:

static void HMAC_finish(uECC_HashContext *hash_context, const uint8_t *K, uint8_t *result) {
    uint8_t *pad = hash_context->tmp + 2 * hash_context->result_size;
    unsigned i;
    for (i = 0; i < hash_context->result_size; ++i)
        pad[i] = K[i] ^ 0x5c;
    for (; i < hash_context->block_size; ++i)
        pad[i] = 0x5c;

    hash_context->finish_hash(hash_context, result);

    hash_context->init_hash(hash_context);
    hash_context->update_hash(hash_context, pad, hash_context->block_size);
    hash_context->update_hash(hash_context, result, hash_context->result_size);
    hash_context->finish_hash(hash_context, result);
}